

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O3

void __thiscall bandit::reporter::info::output_not_yet_shown_context_start_messages(info *this)

{
  _Elt_pointer pcVar1;
  int iVar2;
  stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
  temp_stack;
  _Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  iVar2 = 0;
  std::
  _Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
  ::_M_initialize_map(&local_88,0);
  if (0 < this->not_yet_shown_) {
    do {
      pcVar1 = (this->context_stack_).c.
               super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pcVar1 == (this->context_stack_).c.
                    super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pcVar1 = (this->context_stack_).c.
                 super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      std::
      deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
      ::push_back((deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                   *)&local_88,pcVar1 + -1);
      std::
      deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
      ::pop_back(&(this->context_stack_).c);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->not_yet_shown_);
    if (0 < this->not_yet_shown_) {
      iVar2 = 0;
      do {
        pcVar1 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pcVar1 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        std::
        deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
        ::push_back(&(this->context_stack_).c,pcVar1 + -1);
        output_context_start_message(this);
        std::
        deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
        ::pop_back((deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                    *)&local_88);
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->not_yet_shown_);
    }
  }
  this->not_yet_shown_ = 0;
  std::
  deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
  ::~deque((deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
            *)&local_88);
  return;
}

Assistant:

void output_not_yet_shown_context_start_messages() {
        std::stack<context_info> temp_stack;
        for (int i = 0; i < not_yet_shown_; ++i) {
          temp_stack.push(context_stack_.top());
          context_stack_.pop();
        }
        for (int i = 0; i < not_yet_shown_; ++i) {
          context_stack_.push(temp_stack.top());
          output_context_start_message();
          temp_stack.pop();
        }
        not_yet_shown_ = 0;
      }